

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

uint32_t av1_get_crc32c_value_c(void *c,uint8_t *buf,size_t len)

{
  ulong uVar1;
  uint8_t *next;
  uint8_t *puVar2;
  ulong uVar3;
  
  uVar1 = 0xffffffff;
  for (puVar2 = buf; (len != 0 && (((ulong)puVar2 & 7) != 0)); puVar2 = puVar2 + 1) {
    uVar3 = *(ulong *)buf;
    buf = (uint8_t *)((long)buf + 1);
    uVar1 = uVar1 >> 8 ^ (ulong)*(uint *)((long)c + (ulong)(byte)((byte)uVar3 ^ (byte)uVar1) * 4);
    len = len - 1;
  }
  for (; 7 < len; len = len - 8) {
    uVar3 = *(ulong *)buf;
    uVar1 = uVar1 ^ uVar3;
    uVar1 = (ulong)(*(uint *)((long)c + (ulong)((uint)(uVar1 >> 8) & 0xff) * 4 + 0x1800) ^
                    *(uint *)((long)c + (ulong)((uint)uVar1 & 0xff) * 4 + 0x1c00) ^
                    *(uint *)((long)c + (ulong)((uint)(uVar1 >> 0xe) & 0x3fc) + 0x1400) ^
                    *(uint *)((long)c + (uVar1 >> 0x18 & 0xff) * 4 + 0x1000) ^
                    *(uint *)((long)c + (uVar1 >> 0x1e & 0x3fc) + 0xc00) ^
                    *(uint *)((long)c + (uVar3 >> 0x26 & 0x3fc) + 0x800) ^
                    *(uint *)((long)c + (uVar3 >> 0x2e & 0x3fc) + 0x400) ^
                   *(uint *)((long)c + (uVar3 >> 0x38) * 4));
    buf = (uint8_t *)((long)buf + 8);
  }
  for (uVar3 = 0; len != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = uVar1 >> 8 ^
            (ulong)*(uint *)((long)c + (ulong)(byte)(*(byte *)((long)buf + uVar3) ^ (byte)uVar1) * 4
                            );
  }
  return ~(uint)uVar1;
}

Assistant:

uint32_t av1_get_crc32c_value_c(void *c, uint8_t *buf, size_t len) {
  const uint8_t *next = (const uint8_t *)(buf);
  uint64_t crc;
  CRC32C *p = (CRC32C *)c;
  crc = 0 ^ 0xffffffff;
  while (len && ((uintptr_t)next & 7) != 0) {
    crc = p->table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
    len--;
  }
  while (len >= 8) {
    crc ^= *(uint64_t *)next;
    crc = p->table[7][crc & 0xff] ^ p->table[6][(crc >> 8) & 0xff] ^
          p->table[5][(crc >> 16) & 0xff] ^ p->table[4][(crc >> 24) & 0xff] ^
          p->table[3][(crc >> 32) & 0xff] ^ p->table[2][(crc >> 40) & 0xff] ^
          p->table[1][(crc >> 48) & 0xff] ^ p->table[0][crc >> 56];
    next += 8;
    len -= 8;
  }
  while (len) {
    crc = p->table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
    len--;
  }
  return (uint32_t)crc ^ 0xffffffff;
}